

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

uint64_t advance_pc(CPUX86State *env,DisasContext *s,int num_bytes)

{
  uint64_t uVar1;
  uint8_t unused;
  uint64_t pc;
  int num_bytes_local;
  DisasContext *s_local;
  CPUX86State *env_local;
  
  uVar1 = s->pc;
  s->pc = (long)num_bytes + s->pc;
  if (0xf < s->pc - s->pc_start) {
    if (((s->pc - 1 ^ uVar1 - 1) & 0xfffffffffffff000) != 0) {
      cpu_ldub_code_x86_64(env,s->pc - 1 & 0xfffffffffffff000);
    }
    siglongjmp((__jmp_buf_tag *)s->jmpbuf,1);
  }
  return uVar1;
}

Assistant:

static uint64_t advance_pc(CPUX86State *env, DisasContext *s, int num_bytes)
{
    uint64_t pc = s->pc;

    s->pc += num_bytes;
    if (unlikely(s->pc - s->pc_start > X86_MAX_INSN_LENGTH)) {
        /* If the instruction's 16th byte is on a different page than the 1st, a
         * page fault on the second page wins over the general protection fault
         * caused by the instruction being too long.
         * This can happen even if the operand is only one byte long!
         */
        if (((s->pc - 1) ^ (pc - 1)) & TARGET_PAGE_MASK) {
            volatile uint8_t unused =
                cpu_ldub_code(env, (s->pc - 1) & TARGET_PAGE_MASK);
            (void) unused;
        }
        siglongjmp(s->jmpbuf, 1);
    }

    return pc;
}